

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O0

void __thiscall ProblemDecTiger::FillRewardModel(ProblemDecTiger *this)

{
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x180))(0xc000000000000000,in_RDI,0);
  (**(code **)(*in_RDI + 0x180))(0xc000000000000000,in_RDI,1,0);
  (**(code **)(*in_RDI + 0x180))(0xc059400000000000,in_RDI,0,1);
  (**(code **)(*in_RDI + 0x180))(0x4022000000000000,in_RDI,0,2);
  (**(code **)(*in_RDI + 0x180))(0xc059400000000000,in_RDI,0,3);
  (**(code **)(*in_RDI + 0x180))(0xc049000000000000,in_RDI,0,4);
  (**(code **)(*in_RDI + 0x180))(0xc059000000000000,in_RDI,0,5);
  (**(code **)(*in_RDI + 0x180))(0x4022000000000000,in_RDI,0,6);
  (**(code **)(*in_RDI + 0x180))(0xc059000000000000,in_RDI,0,7);
  (**(code **)(*in_RDI + 0x180))(0x4034000000000000,in_RDI,0,8);
  (**(code **)(*in_RDI + 0x180))(0x4022000000000000,in_RDI,1);
  (**(code **)(*in_RDI + 0x180))(0xc059400000000000,in_RDI,1,2);
  (**(code **)(*in_RDI + 0x180))(0x4022000000000000,in_RDI,1,3);
  (**(code **)(*in_RDI + 0x180))(0x4034000000000000,in_RDI,1,4);
  (**(code **)(*in_RDI + 0x180))(0xc059000000000000,in_RDI,1,5);
  (**(code **)(*in_RDI + 0x180))(0xc059400000000000,in_RDI,1,6);
  (**(code **)(*in_RDI + 0x180))(0xc059000000000000,in_RDI,1,7);
  (**(code **)(*in_RDI + 0x180))(0xc049000000000000,in_RDI,1,8);
  return;
}

Assistant:

void ProblemDecTiger::FillRewardModel()
{
    SetReward(SLEFT, LISTEN_LISTEN, -2);
    SetReward(SRIGHT, LISTEN_LISTEN, -2);
    SetReward(SLEFT, LISTEN_OPENLEFT, -101);
    SetReward(SLEFT, LISTEN_OPENRIGHT, +9);
    SetReward(SLEFT, OPENLEFT_LISTEN, -101);
    SetReward(SLEFT, OPENLEFT_OPENLEFT, -50);
    SetReward(SLEFT, OPENLEFT_OPENRIGHT, -100);
    SetReward(SLEFT, OPENRIGHT_LISTEN, +9);
    SetReward(SLEFT, OPENRIGHT_OPENLEFT, -100);
    SetReward(SLEFT, OPENRIGHT_OPENRIGHT, +20);
    SetReward(SRIGHT, LISTEN_OPENLEFT, +9);
    SetReward(SRIGHT, LISTEN_OPENRIGHT, -101);
    SetReward(SRIGHT, OPENLEFT_LISTEN, +9);
    SetReward(SRIGHT, OPENLEFT_OPENLEFT, +20);
    SetReward(SRIGHT, OPENLEFT_OPENRIGHT, -100);
    SetReward(SRIGHT, OPENRIGHT_LISTEN, -101);
    SetReward(SRIGHT, OPENRIGHT_OPENLEFT, -100);
    SetReward(SRIGHT, OPENRIGHT_OPENRIGHT, -50);
}